

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_graph.cc
# Opt level: O0

string_view __thiscall InputGraph::edge_label(InputGraph *this,int a,int b)

{
  pointer pIVar1;
  __sv_type _Var2;
  string_view sVar3;
  map<std::pair<int,_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  pair<int,_int> local_30;
  _Base_ptr local_28;
  int local_20;
  int local_1c [7];
  
  pIVar1 = std::unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>::operator->
                     ((unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_> *)0x1ba58b
                     );
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pIVar1->edges;
  std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_30,local_1c,&local_20);
  local_28 = (_Base_ptr)
             std::
             map<std::pair<int,_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(in_stack_ffffffffffffffb8,(key_type *)0x1ba5bc);
  std::
  _Rb_tree_iterator<std::pair<const_std::pair<int,_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator->((_Rb_tree_iterator<std::pair<const_std::pair<int,_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x1ba5cb);
  _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view(this_00);
  sVar3._M_len = _Var2._M_len;
  sVar3._M_str = _Var2._M_str;
  return sVar3;
}

Assistant:

auto InputGraph::edge_label(int a, int b) const -> string_view
{
    return _imp->edges.find({a, b})->second;
}